

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeClearTable(Btree *p,int iTable,i64 *pnChange)

{
  int *piVar1;
  BtShared *pBt;
  int iVar2;
  BtCursor *pBVar3;
  
  pBt = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  iVar2 = saveAllCursors(pBt,iTable,(BtCursor *)0x0);
  if (iVar2 == 0) {
    if (p->hasIncrblobCur != '\0') {
      p->hasIncrblobCur = '\0';
      for (pBVar3 = p->pBt->pCursor; pBVar3 != (BtCursor *)0x0; pBVar3 = pBVar3->pNext) {
        if (((pBVar3->curFlags & 0x10) != 0) &&
           (p->hasIncrblobCur = '\x01', pBVar3->pgnoRoot == iTable)) {
          pBVar3->eState = '\x01';
        }
      }
    }
    iVar2 = clearDatabasePage(pBt,iTable,0,pnChange);
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClearTable(Btree *p, int iTable, i64 *pnChange){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );

  rc = saveAllCursors(pBt, (Pgno)iTable, 0);

  if( SQLITE_OK==rc ){
    /* Invalidate all incrblob cursors open on table iTable (assuming iTable
    ** is the root of a table b-tree - if it is not, the following call is
    ** a no-op).  */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, (Pgno)iTable, 0, 1);
    }
    rc = clearDatabasePage(pBt, (Pgno)iTable, 0, pnChange);
  }
  sqlite3BtreeLeave(p);
  return rc;
}